

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>
::_update_largest_death_in_F
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *chainsInF)

{
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>
  *targetColumn;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  pointer pIVar4;
  pointer puVar5;
  ID_index IVar6;
  Column_dimension_option CVar7;
  ID_index IVar8;
  bool bVar9;
  invalid_argument *this_00;
  uint uVar10;
  long *plVar11;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>
  *source;
  pointer ppVar12;
  pointer ppVar13;
  
  ppVar13 = (chainsInF->
            super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar1 = ppVar13->first;
  uVar10 = ppVar13->second;
  pIVar4 = (this->matrix_).
           super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (pIVar4[uVar1].operators_)->characteristic_;
  if (uVar2 <= uVar10) {
    uVar10 = uVar10 % uVar2;
  }
  if (uVar10 != 1) {
    if (uVar10 == 0) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (this_00,"A chain column should not be multiplied by 0.");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    plVar11 = *(long **)&pIVar4[uVar1].column_.super_type.data_.root_plus_size_;
    if ((Column_support *)plVar11 != &pIVar4[uVar1].column_) {
      do {
        persistence_fields::Zp_field_operators<unsigned_int,_void>::multiply_inplace
                  (pIVar4[uVar1].operators_,(Element *)((long)plVar11 + -0x14),uVar10);
        plVar11 = (long *)*plVar11;
      } while ((Column_support *)plVar11 != &pIVar4[uVar1].column_);
      ppVar13 = (chainsInF->
                super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  while (ppVar12 = ppVar13 + 1,
        ppVar12 !=
        (chainsInF->
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
    pIVar4 = (this->matrix_).
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    targetColumn = pIVar4 + uVar1;
    uVar10 = pIVar4[uVar1].super_Chain_column_option.pivot_;
    source = pIVar4 + ppVar12->first;
    bVar9 = _multiply_source_and_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,true>>>>
                      (&ppVar13[1].second,source,targetColumn);
    if (bVar9) {
      CVar7.dim_ = (targetColumn->super_Column_dimension_option).dim_;
      IVar8 = (targetColumn->super_Chain_column_option).pivot_;
      IVar6 = (source->super_Chain_column_option).pivot_;
      targetColumn->super_Column_dimension_option =
           (Column_dimension_option)(source->super_Column_dimension_option).dim_;
      (targetColumn->super_Chain_column_option).pivot_ = IVar6;
      source->super_Column_dimension_option = (Column_dimension_option)CVar7.dim_;
      (source->super_Chain_column_option).pivot_ = IVar8;
    }
    uVar2 = (targetColumn->super_Chain_column_option).pivot_;
    ppVar13 = ppVar12;
    if (uVar10 != uVar2) {
      puVar5 = (this->pivotToColumnIndex_).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = puVar5[uVar10];
      puVar5[uVar10] = puVar5[uVar2];
      puVar5[uVar2] = uVar3;
    }
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_largest_death_in_F(const std::vector<Entry_representative>& chainsInF)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    Index toUpdate = chainsInF[0];
    for (auto other_col_it = chainsInF.begin() + 1; other_col_it != chainsInF.end(); ++other_col_it) {
      add_to(*other_col_it, toUpdate);
    }
  } else {
    Index toUpdate = chainsInF[0].first;
    get_column(toUpdate) *= chainsInF[0].second;
    for (auto other_col_it = chainsInF.begin() + 1; other_col_it != chainsInF.end(); ++other_col_it) {
      multiply_source_and_add_to(other_col_it->second, other_col_it->first, toUpdate);
    }
  }
}